

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-order.c
# Opt level: O2

int run_test_callback_order(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_90;
  uv_idle_t idle;
  
  uVar2 = uv_default_loop();
  uv_idle_init(uVar2,&idle);
  uv_idle_start(&idle,next_tick);
  if (idle_cb_called == 0) {
    if (timer_cb_called == 0) {
      uv_run(uVar2,0);
      if (idle_cb_called == 1) {
        if (timer_cb_called == 1) {
          uVar2 = uv_default_loop();
          uv_walk(uVar2,close_walk_cb,0);
          uv_run(uVar2,0);
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uStack_90 = 0x4b;
        }
        else {
          pcVar3 = "timer_cb_called == 1";
          uStack_90 = 0x49;
        }
      }
      else {
        pcVar3 = "idle_cb_called == 1";
        uStack_90 = 0x48;
      }
    }
    else {
      pcVar3 = "timer_cb_called == 0";
      uStack_90 = 0x44;
    }
  }
  else {
    pcVar3 = "idle_cb_called == 0";
    uStack_90 = 0x43;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-callback-order.c"
          ,uStack_90,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(callback_order) {
  uv_loop_t* loop;
  uv_idle_t idle;

  loop = uv_default_loop();
  uv_idle_init(loop, &idle);
  uv_idle_start(&idle, next_tick);

  ASSERT(idle_cb_called == 0);
  ASSERT(timer_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(idle_cb_called == 1);
  ASSERT(timer_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}